

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::dogulitemxsummary(summarycalc *this)

{
  int sidx;
  OASIS_FLOAT gul;
  int coverage_or_output_id;
  OASIS_FLOAT item_id;
  int event_id;
  int sample_size;
  bool bVar1;
  size_t sVar2;
  OASIS_FLOAT *pOVar3;
  reference pvVar4;
  ostream *poVar5;
  int local_3c;
  OASIS_FLOAT local_38;
  gulSampleslevelRec gr;
  int cov_id;
  int coverage_id;
  int iStack_24;
  bool havedata;
  gulSampleslevelHeader gh;
  uint samplesize;
  int stream_type;
  int i;
  uint streamtype;
  summarycalc *this_local;
  
  _i = this;
  loadcoverages(this);
  loaditemtocoverage(this);
  loadgulsummaryxref(this);
  outputstreamtype(this);
  stream_type = 0;
  fread(&stream_type,4,1,_stdin);
  bVar1 = isGulStream(this,stream_type);
  if (bVar1) {
    gh.item_id = stream_type & 0xffffff;
    gh.event_id = 0;
    if (gh.item_id != 1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"summarycalc: Unexpected Gul stream type ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,gh.item_id);
      std::operator<<(poVar5," expecting gulitem stream\n");
      exit(-1);
    }
    sVar2 = fread(&gh,4,1,_stdin);
    samplesize = (uint)sVar2;
    alloc_sssl_array(this,gh.event_id);
    reset_sssl_array(this,gh.event_id);
    alloc_sse_array(this);
    reset_sse_array(this);
    outputsamplesize(this,gh.event_id);
    bVar1 = false;
LAB_0010464b:
    if (samplesize == 1) {
      sVar2 = fread(&coverage_id,8,1,_stdin);
      samplesize = (uint)sVar2;
      if ((0 < (int)samplesize) && (!bVar1)) {
        bVar1 = true;
      }
      if (samplesize == 0) {
        return;
      }
      pOVar3 = (OASIS_FLOAT *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->item_to_coverage_,(long)iStack_24);
      gr.loss = *pOVar3;
      gr.sidx = getcovid(this,(int)gr.loss);
      while (samplesize != 0) {
        sVar2 = fread(&local_3c,8,1,_stdin);
        sample_size = gh.event_id;
        event_id = coverage_id;
        item_id = gr.loss;
        coverage_or_output_id = gr.sidx;
        gul = local_38;
        sidx = local_3c;
        samplesize = (uint)sVar2;
        if ((samplesize == 0) || (local_3c == 0)) break;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&this->coverages_,(long)(int)gr.loss);
        dosummary(this,sample_size,event_id,(int)item_id,coverage_or_output_id,sidx,gul,*pvVar4);
      }
      goto LAB_0010464b;
    }
  }
  return;
}

Assistant:

void summarycalc::dogulitemxsummary()
{
	loadcoverages();
	loaditemtocoverage();
	loadgulsummaryxref();
	outputstreamtype();
	unsigned int streamtype = 0;
	int i = (int) fread(&streamtype, sizeof(streamtype), 1, stdin);
	if (isGulStream(streamtype) == true) {
		int stream_type = streamtype & streamno_mask;
		unsigned int samplesize = 0;
		if (stream_type == 1) {
			i = (int) fread(&samplesize, sizeof(samplesize), 1, stdin);
			alloc_sssl_array(samplesize);
			reset_sssl_array(samplesize);
			alloc_sse_array();
			reset_sse_array();
			outputsamplesize(samplesize);
			gulSampleslevelHeader gh;
			bool havedata = false;
			while (i == 1) {
				i = (int)fread(&gh, sizeof(gh), 1, stdin);
				if (i > 0 && havedata == false) havedata = true;
				if (i == 0) break;
				int coverage_id = item_to_coverage_[gh.item_id];
				int cov_id = getcovid(coverage_id);
				while (i != 0) {
					gulSampleslevelRec gr;
					i = (int) fread(&gr, sizeof(gr), 1, stdin);
					if (i == 0) break;
					if (gr.sidx == 0) break;
					dosummary(samplesize, gh.event_id,
						  coverage_id, cov_id, gr.sidx,
						  gr.loss,
						  coverages_[coverage_id]);
				}
			}
			return;
		}
		std::cerr << "summarycalc: Unexpected Gul stream type " << stream_type << " expecting gulitem stream\n";
		::exit(-1);
	}
}